

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.h
# Opt level: O1

void __thiscall DIS::DetonationPdu::setDescriptor(DetonationPdu *this,MunitionDescriptor *pX)

{
  uchar uVar1;
  unsigned_short uVar2;
  uchar uVar3;
  uchar uVar4;
  uchar uVar5;
  uchar uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  
  uVar1 = (pX->_munitionType)._domain;
  uVar2 = (pX->_munitionType)._country;
  uVar3 = (pX->_munitionType)._category;
  uVar4 = (pX->_munitionType)._subcategory;
  uVar5 = (pX->_munitionType)._specific;
  uVar6 = (pX->_munitionType)._extra;
  (this->_descriptor)._munitionType._entityKind = (pX->_munitionType)._entityKind;
  (this->_descriptor)._munitionType._domain = uVar1;
  (this->_descriptor)._munitionType._country = uVar2;
  (this->_descriptor)._munitionType._category = uVar3;
  (this->_descriptor)._munitionType._subcategory = uVar4;
  (this->_descriptor)._munitionType._specific = uVar5;
  (this->_descriptor)._munitionType._extra = uVar6;
  uVar2 = pX->_fuse;
  uVar7 = pX->_quantity;
  uVar8 = pX->_rate;
  (this->_descriptor)._warhead = pX->_warhead;
  (this->_descriptor)._fuse = uVar2;
  (this->_descriptor)._quantity = uVar7;
  (this->_descriptor)._rate = uVar8;
  return;
}

Assistant:

class OPENDIS7_EXPORT EntityType
{
protected:
  /** Kind of entity */
  unsigned char _entityKind; 

  /** Domain of entity (air, surface, subsurface, space, etc) */
  unsigned char _domain; 

  /** country to which the design of the entity is attributed */
  unsigned short _country; 

  /** category of entity */
  unsigned char _category; 

  /** subcategory of entity */
  unsigned char _subcategory; 

  /** specific info based on subcategory field. Renamed from specific because that is a reserved word in SQL. */
  unsigned char _specific; 

  unsigned char _extra; 


 public:
    EntityType();
    virtual ~EntityType();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getEntityKind() const; 
    void setEntityKind(unsigned char pX); 

    unsigned char getDomain() const; 
    void setDomain(unsigned char pX); 

    unsigned short getCountry() const; 
    void setCountry(unsigned short pX); 

    unsigned char getCategory() const; 
    void setCategory(unsigned char pX); 

    unsigned char getSubcategory() const; 
    void setSubcategory(unsigned char pX); 

    unsigned char getSpecific() const; 
    void setSpecific(unsigned char pX); 

    unsigned char getExtra() const; 
    void setExtra(unsigned char pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const EntityType& rhs) const;
}